

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float *output;
  void *__ptr;
  int req_comp_00;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  void *pvVar13;
  float *output_00;
  int iVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int local_494;
  float *local_488;
  char *local_448;
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  
  stbi__hdr_gettoken(s,buffer);
  iVar5 = bcmp(buffer,"#?RADIANCE",0xb);
  if (iVar5 == 0) {
    local_494 = 1;
    bVar17 = false;
    while (stbi__hdr_gettoken(s,buffer), buffer[0] != '\0') {
      iVar5 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar5 == 0) {
        bVar17 = true;
      }
    }
    if (bVar17) {
      stbi__hdr_gettoken(s,buffer);
      iVar5 = bcmp(buffer,"-Y ",3);
      if (iVar5 == 0) {
        local_448 = buffer + 3;
        uVar6 = strtol(local_448,&local_448,10);
        local_448 = local_448 + 2;
        do {
          pcVar10 = local_448;
          local_448 = pcVar10 + 1;
        } while (pcVar10[-2] == ' ');
        if (((pcVar10[-2] == '+') && (pcVar10[-1] == 'X')) && (*pcVar10 == ' ')) {
          iVar14 = 0;
          uVar7 = strtol(local_448,(char **)0x0,10);
          uVar11 = (uint)uVar7;
          *x = uVar11;
          iVar5 = (int)uVar6;
          *y = iVar5;
          if (comp != (int *)0x0) {
            *comp = 3;
          }
          req_comp_00 = 3;
          if (req_comp != 0) {
            req_comp_00 = req_comp;
          }
          output = (float *)malloc((long)(int)(iVar5 * uVar11 * req_comp_00) << 2);
          if (uVar11 - 0x8000 < 0xffff8008) goto LAB_001166ac;
          uVar16 = 0;
          uVar8 = 0;
          if (0 < iVar5) {
            uVar8 = uVar6 & 0xffffffff;
          }
          __ptr = (void *)0x0;
          local_488 = output;
          while( true ) {
            if (uVar16 == uVar8) {
              free(__ptr);
              return output;
            }
            sVar1 = stbi__get8(s);
            sVar2 = stbi__get8(s);
            sVar3 = stbi__get8(s);
            if (((sVar1 != '\x02') || (sVar2 != '\x02')) || ((char)sVar3 < '\0')) break;
            sVar1 = stbi__get8(s);
            if (CONCAT11(sVar3,sVar1) != uVar11) {
              free(output);
              free(__ptr);
              stbi__g_failure_reason = "invalid decoded scanline length";
              return (float *)0x0;
            }
            if (__ptr == (void *)0x0) {
              __ptr = malloc((ulong)(uVar11 * 4));
            }
            pvVar13 = __ptr;
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              lVar12 = 0;
              while (iVar14 = (int)lVar12, iVar14 < (int)uVar11) {
                bVar4 = stbi__get8(s);
                uVar9 = (uint)bVar4;
                if (bVar4 < 0x81) {
                  lVar12 = (long)iVar14;
                  while (bVar17 = uVar9 != 0, uVar9 = uVar9 - 1, bVar17) {
                    sVar1 = stbi__get8(s);
                    *(stbi_uc *)((long)pvVar13 + lVar12 * 4) = sVar1;
                    lVar12 = lVar12 + 1;
                  }
                }
                else {
                  sVar1 = stbi__get8(s);
                  uVar9 = bVar4 & 0x7f;
                  lVar12 = (long)iVar14;
                  while (bVar17 = uVar9 != 0, uVar9 = uVar9 - 1, bVar17) {
                    *(stbi_uc *)((long)pvVar13 + lVar12 * 4) = sVar1;
                    lVar12 = lVar12 + 1;
                  }
                }
              }
              pvVar13 = (void *)((long)pvVar13 + 1);
            }
            output_00 = local_488;
            for (lVar15 = 0; (uVar7 & 0xffffffff) << 2 != lVar15; lVar15 = lVar15 + 4) {
              stbi__hdr_convert(output_00,(stbi_uc *)(lVar15 + (long)__ptr),req_comp_00);
              output_00 = output_00 + req_comp_00;
            }
            uVar16 = uVar16 + 1;
            local_488 = local_488 + (long)req_comp_00 * (uVar7 & 0xffffffff);
          }
          rgbe[0] = sVar1;
          rgbe[1] = sVar2;
          rgbe[2] = sVar3;
          rgbe[3] = stbi__get8(s);
          stbi__hdr_convert(output,rgbe,req_comp_00);
          free(__ptr);
          iVar14 = 0;
          do {
            stbi__getn(s,rgbe_1,4);
            stbi__hdr_convert(output + (long)(int)(req_comp_00 * uVar11 * iVar14) +
                                       (long)(local_494 * req_comp_00),rgbe_1,req_comp_00);
            local_494 = local_494 + 1;
            while ((int)uVar11 <= local_494) {
              iVar14 = iVar14 + 1;
LAB_001166ac:
              local_494 = 0;
              if (iVar5 <= iVar14) {
                return output;
              }
            }
          } while( true );
        }
      }
      stbi__g_failure_reason = "unsupported data layout";
    }
    else {
      stbi__g_failure_reason = "unsupported format";
    }
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}